

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_ocaml_function_helpers(t_ocaml_generator *this,t_function *tfunction)

{
  t_program *program;
  bool bVar1;
  uint uVar2;
  string *psVar3;
  t_type *ptVar4;
  t_struct *this_00;
  reference pptVar5;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_250
  ;
  t_field **local_248;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_240
  ;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *xs;
  string local_220;
  undefined1 local_200 [8];
  t_field success;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  t_struct result;
  t_function *tfunction_local;
  t_ocaml_generator *this_local;
  
  program = (this->super_t_oop_generator).super_t_generator.program_;
  result._192_8_ = tfunction;
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  std::__cxx11::string::string((string *)&local_140,(string *)psVar3);
  t_generator::decapitalize(&local_120,(t_generator *)this,&local_140);
  std::operator+(&local_100,&local_120,"_result");
  t_struct::t_struct((t_struct *)local_e0,program,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  ptVar4 = t_function::get_returntype((t_function *)result._192_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"success",(allocator *)((long)&xs + 7));
  t_field::t_field((t_field *)local_200,ptVar4,&local_220,0);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&xs + 7));
  ptVar4 = t_function::get_returntype((t_function *)result._192_8_);
  uVar2 = (*(ptVar4->super_t_doc)._vptr_t_doc[4])();
  if ((uVar2 & 1) == 0) {
    t_struct::append((t_struct *)local_e0,(t_field *)local_200);
  }
  this_00 = t_function::get_xceptions((t_function *)result._192_8_);
  f_iter._M_current = (t_field **)t_struct::get_members(this_00);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_240);
  local_248 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_240._M_current = local_248;
  while( true ) {
    local_250._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_240,&local_250);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_240);
    t_struct::append((t_struct *)local_e0,*pptVar5);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_240);
  }
  generate_ocaml_struct_definition(this,(ostream *)&this->f_service_,(t_struct *)local_e0,false);
  t_field::~t_field((t_field *)local_200);
  t_struct::~t_struct((t_struct *)local_e0);
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_function_helpers(t_function* tfunction) {
  t_struct result(program_, decapitalize(tfunction->get_name()) + "_result");
  t_field success(tfunction->get_returntype(), "success", 0);
  if (!tfunction->get_returntype()->is_void()) {
    result.append(&success);
  }

  t_struct* xs = tfunction->get_xceptions();
  const vector<t_field*>& fields = xs->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    result.append(*f_iter);
  }
  generate_ocaml_struct_definition(f_service_, &result, false);
}